

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCof.c
# Opt level: O3

int Cof_ObjLevel(Cof_Man_t *p,Cof_Obj_t *pObj)

{
  uint *puVar1;
  uint uVar2;
  void *pvVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar5 = (uint)pObj;
  if (((int)uVar5 < 0) || (p->nObjs <= (int)uVar5)) {
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  puVar1 = *(uint **)&p[1].nObjData;
  uVar2 = puVar1[1];
  if ((int)uVar5 < (int)uVar2) {
    if (uVar2 <= uVar5) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    goto LAB_00693f7b;
  }
  uVar4 = uVar5 + 1;
  uVar6 = *puVar1 * 2;
  if ((int)uVar5 < (int)uVar6) {
    if ((int)*puVar1 <= (int)uVar5) {
      if (*(void **)(puVar1 + 2) == (void *)0x0) {
        pvVar3 = malloc((ulong)uVar6 << 2);
      }
      else {
        pvVar3 = realloc(*(void **)(puVar1 + 2),(ulong)uVar6 << 2);
      }
      *(void **)(puVar1 + 2) = pvVar3;
      goto LAB_00693f4b;
    }
  }
  else {
    if (*(void **)(puVar1 + 2) == (void *)0x0) {
      pvVar3 = malloc((ulong)uVar4 << 2);
    }
    else {
      pvVar3 = realloc(*(void **)(puVar1 + 2),(ulong)uVar4 << 2);
    }
    *(void **)(puVar1 + 2) = pvVar3;
    uVar6 = uVar4;
LAB_00693f4b:
    if (pvVar3 == (void *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    *puVar1 = uVar6;
    uVar2 = puVar1[1];
  }
  if ((int)uVar2 <= (int)uVar5) {
    memset((void *)((long)(int)uVar2 * 4 + *(long *)(puVar1 + 2)),0,(ulong)(uVar5 - uVar2) * 4 + 4);
  }
  puVar1[1] = uVar4;
LAB_00693f7b:
  return *(int *)(*(long *)(puVar1 + 2) + ((ulong)pObj & 0xffffffff) * 4);
}

Assistant:

static inline int         Cof_ObjLevel( Cof_Man_t * p, Cof_Obj_t * pObj )             { return Gia_ObjLevel(p->pGia, Gia_ManObj(p->pGia,pObj->Id)); }